

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

thousands_sep_result<char> *
fmt::v10::detail::thousands_sep<char>
          (thousands_sep_result<char> *__return_storage_ptr__,locale_ref loc)

{
  numpunct *pnVar1;
  thousands_sep_result<char> result;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [8];
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [8];
  undefined4 uStack_28;
  undefined4 uStack_24;
  char local_20;
  
  if (loc.locale_ == (void *)0x0) {
    std::locale::locale((locale *)&local_60);
  }
  else {
    std::locale::locale((locale *)&local_60,(locale *)loc.locale_);
  }
  pnVar1 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_60);
  std::locale::~locale((locale *)&local_60);
  (**(code **)(*(long *)pnVar1 + 0x20))(&local_60,pnVar1);
  if (local_58 == 0) {
    local_20 = '\0';
  }
  else {
    local_20 = (**(code **)(*(long *)pnVar1 + 0x18))(pnVar1);
  }
  if (local_60 == local_50) {
    uStack_28 = uStack_48;
    uStack_24 = uStack_44;
    local_60 = local_30;
  }
  local_38 = local_58;
  (__return_storage_ptr__->grouping)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->grouping).field_2;
  local_40 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_60,local_60 + local_58);
  __return_storage_ptr__->thousands_sep = local_20;
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto thousands_sep(locale_ref loc) -> thousands_sep_result<Char> {
  auto result = thousands_sep_impl<char>(loc);
  return {result.grouping, Char(result.thousands_sep)};
}